

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boing.c
# Opt level: O1

void DrawBoingBallBand(GLfloat long_lo,GLfloat long_hi)

{
  GLfloat GVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  double __x;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  GLfloat GVar16;
  float fVar17;
  double __x_00;
  double dVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  __x_00 = ((double)long_lo / 360.0) * 6.283185307179586;
  __x = ((double)(long_lo + 22.5) / 360.0) * 6.283185307179586;
  fVar4 = 0.0;
  do {
    if (DrawBoingBallBand::colorToggle == 0) {
      GVar1 = 0.95;
      GVar16 = 0.95;
    }
    else {
      GVar1 = 0.8;
      GVar16 = 0.1;
    }
    (*glad_glColor3f)(GVar1,GVar16,GVar16);
    DrawBoingBallBand::colorToggle = (int)(DrawBoingBallBand::colorToggle == 0);
    if (drawBallHow == DRAW_BALL_SHADOW) {
      (*glad_glColor3f)(0.35,0.35,0.35);
    }
    dVar9 = cos(((double)long_hi / 360.0) * 6.283185307179586);
    fVar17 = (float)dVar9 * 70.0;
    dVar9 = cos(__x_00);
    fVar2 = (float)dVar9 * 70.0;
    dVar18 = ((double)fVar4 / 360.0) * 6.283185307179586;
    dVar9 = cos(dVar18);
    dVar10 = sin(__x);
    fVar3 = (float)dVar10 * 70.0 * (float)dVar9;
    dVar9 = cos(dVar18);
    dVar10 = sin(__x_00);
    fVar4 = fVar4 + 22.5;
    dVar11 = ((double)fVar4 / 360.0) * 6.283185307179586;
    dVar12 = cos(dVar11);
    dVar13 = sin(__x);
    fVar5 = (float)dVar13 * 70.0 * (float)dVar12;
    dVar12 = cos(dVar11);
    dVar13 = sin(__x_00);
    fVar6 = (float)dVar13 * 70.0 * (float)dVar12;
    dVar12 = sin(dVar18);
    dVar13 = sin(__x);
    fVar7 = (float)dVar13 * 70.0 * (float)dVar12;
    dVar12 = sin(dVar18);
    dVar13 = sin(__x_00);
    dVar18 = sin(dVar11);
    dVar14 = sin(__x);
    dVar11 = sin(dVar11);
    dVar15 = sin(__x_00);
    fVar8 = (float)dVar15 * 70.0 * (float)dVar11;
    (*glad_glBegin)(9);
    fVar19 = fVar5 - fVar3;
    fVar20 = fVar6 - fVar3;
    fVar21 = fVar8 - fVar7;
    (*glad_glNormal3f)((fVar17 - fVar17) * fVar21 - (fVar17 - fVar7) * (fVar2 - fVar17),
                       (fVar17 - fVar7) * fVar20 - fVar21 * fVar19,
                       (fVar2 - fVar17) * fVar19 - fVar20 * (fVar17 - fVar17));
    (*glad_glVertex3f)(fVar3,fVar17,fVar7);
    (*glad_glVertex3f)(fVar5,fVar17,(float)dVar14 * 70.0 * (float)dVar18);
    (*glad_glVertex3f)(fVar6,fVar2,fVar8);
    (*glad_glVertex3f)((float)dVar10 * 70.0 * (float)dVar9,fVar2,
                       (float)dVar13 * 70.0 * (float)dVar12);
    (*glad_glEnd)();
  } while (fVar4 <= 337.5);
  DrawBoingBallBand::colorToggle = (uint)(DrawBoingBallBand::colorToggle == 0);
  return;
}

Assistant:

void DrawBoingBallBand( GLfloat long_lo,
                        GLfloat long_hi )
{
   vertex_t vert_ne;            /* "ne" means south-east, so on */
   vertex_t vert_nw;
   vertex_t vert_sw;
   vertex_t vert_se;
   vertex_t vert_norm;
   GLfloat  lat_deg;
   static int colorToggle = 0;

  /*
   * Iterate through the points of a latitude circle.
   * A latitude circle is a 2D set of X,Z points.
   */
   for ( lat_deg = 0;
         lat_deg <= (360 - STEP_LATITUDE);
         lat_deg += STEP_LATITUDE )
   {
     /*
      * Color this polygon with red or white.
      */
      if ( colorToggle )
         glColor3f( 0.8f, 0.1f, 0.1f );
      else
         glColor3f( 0.95f, 0.95f, 0.95f );
#if 0
      if ( lat_deg >= 180 )
         if ( colorToggle )
            glColor3f( 0.1f, 0.8f, 0.1f );
         else
            glColor3f( 0.5f, 0.5f, 0.95f );
#endif
      colorToggle = ! colorToggle;

     /*
      * Change color if drawing shadow.
      */
      if ( drawBallHow == DRAW_BALL_SHADOW )
         glColor3f( 0.35f, 0.35f, 0.35f );

     /*
      * Assign each Y.
      */
      vert_ne.y = vert_nw.y = (float) cos_deg(long_hi) * RADIUS;
      vert_sw.y = vert_se.y = (float) cos_deg(long_lo) * RADIUS;

     /*
      * Assign each X,Z with sin,cos values scaled by latitude radius indexed by longitude.
      * Eg, long=0 and long=180 are at the poles, so zero scale is sin(longitude),
      * while long=90 (sin(90)=1) is at equator.
      */
      vert_ne.x = (float) cos_deg( lat_deg                 ) * (RADIUS * (float) sin_deg( long_lo + STEP_LONGITUDE ));
      vert_se.x = (float) cos_deg( lat_deg                 ) * (RADIUS * (float) sin_deg( long_lo                  ));
      vert_nw.x = (float) cos_deg( lat_deg + STEP_LATITUDE ) * (RADIUS * (float) sin_deg( long_lo + STEP_LONGITUDE ));
      vert_sw.x = (float) cos_deg( lat_deg + STEP_LATITUDE ) * (RADIUS * (float) sin_deg( long_lo                  ));

      vert_ne.z = (float) sin_deg( lat_deg                 ) * (RADIUS * (float) sin_deg( long_lo + STEP_LONGITUDE ));
      vert_se.z = (float) sin_deg( lat_deg                 ) * (RADIUS * (float) sin_deg( long_lo                  ));
      vert_nw.z = (float) sin_deg( lat_deg + STEP_LATITUDE ) * (RADIUS * (float) sin_deg( long_lo + STEP_LONGITUDE ));
      vert_sw.z = (float) sin_deg( lat_deg + STEP_LATITUDE ) * (RADIUS * (float) sin_deg( long_lo                  ));

     /*
      * Draw the facet.
      */
      glBegin( GL_POLYGON );

      CrossProduct( vert_ne, vert_nw, vert_sw, &vert_norm );
      glNormal3f( vert_norm.x, vert_norm.y, vert_norm.z );

      glVertex3f( vert_ne.x, vert_ne.y, vert_ne.z );
      glVertex3f( vert_nw.x, vert_nw.y, vert_nw.z );
      glVertex3f( vert_sw.x, vert_sw.y, vert_sw.z );
      glVertex3f( vert_se.x, vert_se.y, vert_se.z );

      glEnd();

#if BOING_DEBUG
      printf( "----------------------------------------------------------- \n" );
      printf( "lat = %f  long_lo = %f  long_hi = %f \n", lat_deg, long_lo, long_hi );
      printf( "vert_ne  x = %.8f  y = %.8f  z = %.8f \n", vert_ne.x, vert_ne.y, vert_ne.z );
      printf( "vert_nw  x = %.8f  y = %.8f  z = %.8f \n", vert_nw.x, vert_nw.y, vert_nw.z );
      printf( "vert_se  x = %.8f  y = %.8f  z = %.8f \n", vert_se.x, vert_se.y, vert_se.z );
      printf( "vert_sw  x = %.8f  y = %.8f  z = %.8f \n", vert_sw.x, vert_sw.y, vert_sw.z );
#endif

   }

  /*
   * Toggle color so that next band will opposite red/white colors than this one.
   */
   colorToggle = ! colorToggle;

  /*
   * This circular band is done.
   */
   return;
}